

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

const_iterator
cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
          (vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           *r)

{
  bool bVar1;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
  it;
  const_iterator cVar2;
  const_iterator it2;
  size_t count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  unique;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_88;
  value_type_conflict1 local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  local_58;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start =
       (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
        *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
        *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
  ::reserve((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
             *)&local_58,
            (long)(r->
                  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(r->
                  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 6);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = 0;
  it2._M_current =
       (r->
       super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
       )._M_impl.super__Vector_impl_data._M_start;
  cVar2._M_current =
       (r->
       super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = r;
  do {
    if (it2._M_current == cVar2._M_current) {
      if (local_78._M_impl.super__Vector_impl_data._M_start !=
          local_78._M_impl.super__Vector_impl_data._M_finish) {
        cVar2 = cmRemoveIndices<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                          (local_38,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &local_78);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
      ::~_Vector_base(&local_58);
      return (const_iterator)cVar2._M_current;
    }
    local_88._M_current = it2._M_current;
    it = std::
         __lower_bound<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>*,std::vector<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>>>,__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>)>>
                   ((__normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
                     )local_58._M_impl.super__Vector_impl_data._M_start,
                    (__normal_iterator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>_>
                     )local_58._M_impl.super__Vector_impl_data._M_finish,&local_88,
                    (_Iter_comp_val<bool_(*)(__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,___gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>)>
                     )0x2ef77e);
    if (it._M_current == local_58._M_impl.super__Vector_impl_data._M_finish) {
LAB_002ebb32:
      local_88._M_current = it2._M_current;
      std::
      vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
      ::_M_insert_rval((vector<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>_>_>
                        *)&local_58,(const_iterator)it._M_current,&local_88);
    }
    else {
      bVar1 = ContainerAlgorithms::
              RemoveDuplicatesAPI<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>,cmFindPackageCommand::ConfigFileInfo>
              ::
              valueCompare<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>*,std::vector<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>>>>>
                        (it,it2);
      if (bVar1) goto LAB_002ebb32;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,&local_80);
    }
    it2._M_current = it2._M_current + 1;
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

typename Range::const_iterator cmRemoveDuplicates(Range& r)
{
  typedef typename ContainerAlgorithms::RemoveDuplicatesAPI<Range> API;
  typedef typename API::value_type T;
  std::vector<T> unique;
  unique.reserve(r.size());
  std::vector<size_t> indices;
  size_t count = 0;
  const typename Range::const_iterator end = r.end();
  for (typename Range::const_iterator it = r.begin(); it != end;
       ++it, ++count) {
    const typename std::vector<T>::iterator low = std::lower_bound(
      unique.begin(), unique.end(), API::uniqueValue(it), API::lessThan);
    if (low == unique.end() || API::valueCompare(low, it)) {
      unique.insert(low, API::uniqueValue(it));
    } else {
      indices.push_back(count);
    }
  }
  if (indices.empty()) {
    return end;
  }
  return cmRemoveIndices(r, indices);
}